

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int setChildPtrmaps(MemPage *pPage)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  ushort uVar4;
  Pgno parent;
  uint uVar5;
  BtShared *pBt;
  u8 *puVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = -0x55555556;
  pBt = pPage->pBt;
  parent = pPage->pgno;
  iVar7 = 0;
  if (pPage->isInit == '\0') {
    iVar7 = btreeInitPage(pPage);
  }
  local_3c = iVar7;
  if (iVar7 == 0) {
    uVar3 = pPage->nCell;
    if ((ulong)uVar3 != 0) {
      uVar8 = 0;
      do {
        uVar4 = pPage->maskPage;
        uVar1 = pPage->aCellIdx[uVar8 * 2];
        uVar2 = pPage->aCellIdx[uVar8 * 2 + 1];
        puVar6 = pPage->aData;
        ptrmapPutOvflPtr(pPage,pPage,puVar6 + (CONCAT11(uVar1,uVar2) & uVar4),&local_3c);
        if (pPage->leaf == '\0') {
          uVar5 = *(uint *)(puVar6 + (CONCAT11(uVar1,uVar2) & uVar4));
          ptrmapPut(pBt,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                        uVar5 << 0x18,'\x05',parent,&local_3c);
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
    if (pPage->leaf == '\0') {
      uVar5 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
      ptrmapPut(pBt,uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18,
                '\x05',parent,&local_3c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
  if( rc!=SQLITE_OK ) return rc;
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

  return rc;
}